

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_bms.cpp
# Opt level: O2

double __thiscall BmsBms::GetBaseBPM(BmsBms *this)

{
  bool bVar1;
  BmsHeader *this_00;
  InvalidFormatAsBpmHeaderException *this_01;
  allocator local_41;
  double local_40;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"BPM",&local_41);
  bVar1 = BmsHeaderTable::IsExists(&this->headers_,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_38,"BPM",&local_41);
    this_00 = BmsHeaderTable::operator[](&this->headers_,&local_38);
    local_40 = BmsHeader::ToFloat(this_00);
    std::__cxx11::string::~string((string *)&local_38);
    if ((local_40 == 0.0) && (!NAN(local_40))) {
      this_01 = (InvalidFormatAsBpmHeaderException *)__cxa_allocate_exception(8);
      InvalidFormatAsBpmHeaderException::InvalidFormatAsBpmHeaderException(this_01);
      __cxa_throw(this_01,&InvalidFormatAsBpmHeaderException::typeinfo,0);
    }
  }
  else {
    local_40 = 120.0;
  }
  return local_40;
}

Assistant:

double 
BmsBms::GetBaseBPM() {
	double bpm = BmsConst::BMS_BASIC_BPM;
	if (this->GetHeaders().IsExists("BPM")) {
		if ((bpm = this->GetHeaders()["BPM"].ToFloat()) == 0.0) {
			throw InvalidFormatAsBpmHeaderException();
		}
	}
	return bpm;
}